

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

reference andres::marray_detail::AccessOperatorHelper<false>::
          execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false,std::allocator<unsigned_long>>
                    (View<int,_false,_std::allocator<unsigned_long>_> *v,
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    it)

{
  runtime_error *this;
  size_t offset;
  size_t local_20;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
  }
  else {
    if (((v->geometry_).dimension_ != 0) || (*it._M_current == 0)) {
      View<int,false,std::allocator<unsigned_long>>::
      coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,false,std::allocator<unsigned_long>> *)v,it,&local_20);
      return v->data_ + local_20;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static typename View<T, isConst, A>::reference
    execute(const View<T, isConst, A>& v, U it)
    {
        v.testInvariant();
        Assert(MARRAY_NO_DEBUG || v.data_ != 0);
        Assert(MARRAY_NO_DEBUG || v.dimension() != 0 || *it == 0);
        std::size_t offset;
        v.coordinatesToOffset(it, offset);
        return v.data_[offset];
    }